

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

void __thiscall happly::PLYData::parseASCII(PLYData *this,istream *inStream,bool verbose)

{
  pointer pEVar1;
  pointer puVar2;
  __uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_> _Var3;
  ostream *poVar4;
  size_t iP;
  ulong uVar5;
  ulong uVar6;
  pointer pEVar7;
  size_t iTok;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  undefined8 local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pEVar1 = (this->elements).super__Vector_base<happly::Element,_std::allocator<happly::Element>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pEVar7 = (this->elements).
                super__Vector_base<happly::Element,_std::allocator<happly::Element>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar7 != pEVar1; pEVar7 = pEVar7 + 1) {
    if (verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  - Processing element: ");
      poVar4 = std::operator<<(poVar4,(string *)pEVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    uVar5 = 0;
    while( true ) {
      puVar2 = (pEVar7->properties).
               super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pEVar7->properties).
                        super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar5)
      break;
      _Var3._M_t.super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
      super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl =
           puVar2[uVar5]._M_t.
           super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>
                            .super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl + 0x10))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
                 super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl,pEVar7->count);
      uVar5 = uVar5 + 1;
    }
    for (uVar5 = 0; uVar5 < pEVar7->count; uVar5 = uVar5 + 1) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>(inStream,(string *)&local_68);
      if ((pEVar7->properties).
          super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pEVar7->properties).
          super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        while (local_68._M_string_length == 0) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    (inStream,(string *)&local_68);
        }
      }
      anon_unknown_3::tokenSplit(&local_48,&local_68);
      local_70 = 0;
      uVar6 = 0;
      while( true ) {
        puVar2 = (pEVar7->properties).
                 super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pEVar7->properties).
                          super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar6)
        break;
        _Var3._M_t.
        super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
        super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl =
             puVar2[uVar6]._M_t.
             super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>._M_t;
        (**(code **)(*(long *)_Var3._M_t.
                              super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>
                              .super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl + 0x18)
        )(_Var3._M_t.
          super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>.
          super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl,&local_48,&local_70);
        uVar6 = uVar6 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

void parseASCII(std::istream& inStream, bool verbose) {

    using std::string;
    using std::vector;

    // Read all elements
    for (Element& elem : elements) {

      if (verbose) {
        std::cout << "  - Processing element: " << elem.name << std::endl;
      }

      for (size_t iP = 0; iP < elem.properties.size(); iP++) {
        elem.properties[iP]->reserve(elem.count);
      }
      for (size_t iEntry = 0; iEntry < elem.count; iEntry++) {

        string line;
        std::getline(inStream, line);

        // Some .ply files seem to include empty lines before the start of property data (though this is not specified
        // in the format description). We attempt to recover and parse such files by skipping any empty lines.
        if (!elem.properties.empty()) { // if the element has no properties, the line _should_ be blank, presumably
          while (line.empty()) { // skip lines until we hit something nonempty
            std::getline(inStream, line);
          }
        }

        vector<string> tokens = tokenSplit(line);
        size_t iTok = 0;
        for (size_t iP = 0; iP < elem.properties.size(); iP++) {
          elem.properties[iP]->parseNext(tokens, iTok);
        }
      }
    }
  }